

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetNextTreeNodeOpen(bool is_open,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->CurrentWindow->SkipItems == false) {
    GImGui->NextTreeNodeOpenVal = is_open;
    pIVar1->NextTreeNodeOpenCond = cond + (uint)(cond == 0);
  }
  return;
}

Assistant:

void ImGui::SetNextTreeNodeOpen(bool is_open, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return;
    g.NextTreeNodeOpenVal = is_open;
    g.NextTreeNodeOpenCond = cond ? cond : ImGuiCond_Always;
}